

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  object *this_00;
  PyObject *pPVar1;
  error_scope scope;
  gil_scoped_acquire gil;
  error_scope eStack_38;
  gil_scoped_acquire local_20;
  
  *(undefined ***)this = &PTR__error_already_set_0013ab28;
  this_00 = &this->m_type;
  if ((this->m_type).super_handle.m_ptr != (PyObject *)0x0) {
    gil_scoped_acquire::gil_scoped_acquire(&local_20);
    PyErr_Fetch(&eStack_38,&eStack_38.value,&eStack_38.trace);
    pPVar1 = (this_00->super_handle).m_ptr;
    (this_00->super_handle).m_ptr = (PyObject *)0x0;
    if ((pPVar1 != (PyObject *)0x0) &&
       (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    pPVar1 = (this->m_value).super_handle.m_ptr;
    (this->m_value).super_handle.m_ptr = (PyObject *)0x0;
    if ((pPVar1 != (PyObject *)0x0) &&
       (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    pPVar1 = (this->m_trace).super_handle.m_ptr;
    (this->m_trace).super_handle.m_ptr = (PyObject *)0x0;
    if ((pPVar1 != (PyObject *)0x0) &&
       (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    error_scope::~error_scope(&eStack_38);
    gil_scoped_acquire::~gil_scoped_acquire(&local_20);
  }
  object::~object(&this->m_trace);
  object::~object(&this->m_value);
  object::~object(this_00);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (m_type) {
        gil_scoped_acquire gil;
        error_scope scope;
        m_type.release().dec_ref();
        m_value.release().dec_ref();
        m_trace.release().dec_ref();
    }
}